

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_scalar_split(secp256k1_scalar *full)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  secp256k1_context *psVar4;
  int iVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  size_t sVar6;
  long lVar7;
  secp256k1_scalar *message;
  uint uVar8;
  int extraout_EDX;
  size_t count;
  secp256k1_scalar *extraout_RDX;
  secp256k1_scalar *sigr;
  secp256k1_scalar *psVar9;
  secp256k1_scalar *seckey;
  uint uVar10;
  undefined1 *puVar11;
  secp256k1_ge *psVar12;
  secp256k1_ge *ge;
  secp256k1_scalar *sigs;
  secp256k1_ge *psVar13;
  secp256k1_context *psVar14;
  ulong uVar15;
  ulong uVar16;
  int *recid;
  byte bVar17;
  secp256k1_ge *psVar18;
  secp256k1_ge *output;
  secp256k1_ge *psVar19;
  uint uVar20;
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar s;
  secp256k1_scalar sStack_328;
  secp256k1_ge *psStack_300;
  secp256k1_ge *psStack_2f8;
  secp256k1_context *psStack_2f0;
  secp256k1_ge *psStack_2e8;
  code *pcStack_2e0;
  long alStack_2d8 [5];
  undefined1 *puStack_2b0;
  secp256k1_ge *psStack_2a8;
  bool bStack_299;
  undefined8 uStack_298;
  undefined1 auStack_290 [65];
  byte abStack_24f [7];
  secp256k1_ge *psStack_248;
  long lStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  size_t sStack_200;
  int iStack_1f8;
  uint uStack_1f4;
  secp256k1_ge *psStack_1f0;
  ulong uStack_1e8;
  undefined1 auStack_1e0 [89];
  uint64_t uStack_187;
  undefined8 uStack_17f;
  uint64_t uStack_177;
  uint64_t uStack_16f;
  uint64_t uStack_167;
  secp256k1_ge sStack_150;
  secp256k1_scalar *psStack_f8;
  secp256k1_ge *psStack_f0;
  secp256k1_scalar local_c8;
  secp256k1_scalar local_a8;
  byte local_88 [32];
  byte local_68 [40];
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  
  local_68[0x10] = 0;
  local_68[0x11] = 0;
  local_68[0x12] = 0;
  local_68[0x13] = 0;
  local_68[0x14] = 0;
  local_68[0x15] = 0;
  local_68[0x16] = 0;
  local_68[0x17] = 0;
  local_68[0x18] = 0;
  local_68[0x19] = 0;
  local_68[0x1a] = 0;
  local_68[0x1b] = 0;
  local_68[0x1c] = 0;
  local_68[0x1d] = 0;
  local_68[0x1e] = 0;
  local_68[0x1f] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[10] = 0;
  local_68[0xb] = 0;
  local_68[0xc] = 0;
  local_68[0xd] = 0;
  local_68[0xe] = 0;
  local_68[0xf] = 0;
  secp256k1_scalar_split_lambda(&local_a8,&local_c8,full);
  psVar18 = (secp256k1_ge *)&stack0xffffffffffffffc0;
  secp256k1_scalar_mul((secp256k1_scalar *)psVar18,&secp256k1_const_lambda,&local_c8);
  psVar12 = psVar18;
  psVar13 = psVar18;
  secp256k1_scalar_add((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18,&local_a8);
  uVar10 = (uint)psVar12;
  if ((((local_40 == full->d[0]) && (local_38 == full->d[1])) && (local_30 == full->d[2])) &&
     (local_28 == full->d[3])) {
    uVar20 = -(int)((long)local_a8.d[3] >> 0x3f);
    uVar8 = uVar20 ^ 1;
    uVar10 = uVar8;
    if (local_a8.d[2] == 0xffffffffffffffff) {
      uVar10 = 0;
    }
    if (0x5d576e7357a4501c < local_a8.d[1]) {
      uVar8 = 0;
    }
    uVar8 = (uVar8 | uVar10 | local_a8.d[3] < 0x7fffffffffffffff) ^ 1;
    psVar18 = (secp256k1_ge *)0xdfe92f46681b20a0;
    uVar10 = 0;
    if (0xdfe92f46681b20a0 < local_a8.d[0]) {
      uVar10 = uVar8;
    }
    if (0x5d576e7357a4501d < local_a8.d[1]) {
      uVar10 = uVar8;
    }
    if (uVar10 != 0 || uVar20 != 0) {
      secp256k1_scalar_negate(&local_a8,&local_a8);
    }
    uVar20 = (uint)(local_c8.d[3] >> 0x3f);
    uVar8 = uVar20 ^ 1;
    uVar10 = uVar8;
    if (local_c8.d[2] == 0xffffffffffffffff) {
      uVar10 = 0;
    }
    if (0x5d576e7357a4501c < local_c8.d[1]) {
      uVar8 = 0;
    }
    uVar8 = (uVar8 | uVar10 | local_c8.d[3] < 0x7fffffffffffffff) ^ 1;
    uVar10 = 0;
    if (0xdfe92f46681b20a0 < local_c8.d[0]) {
      uVar10 = uVar8;
    }
    if (0x5d576e7357a4501d < local_c8.d[1]) {
      uVar10 = uVar8;
    }
    uVar10 = uVar10 | uVar20;
    full = (secp256k1_scalar *)(ulong)uVar10;
    if (uVar10 != 0) {
      secp256k1_scalar_negate(&local_c8,&local_c8);
    }
    secp256k1_scalar_get_b32(local_88,&local_a8);
    lVar7 = 0;
    uVar15 = extraout_RAX;
    do {
      uVar16 = uVar15 & 0xffffffff;
      bVar17 = local_68[lVar7];
      uVar10 = (uint)bVar17;
      bVar1 = local_88[lVar7];
      psVar13 = (secp256k1_ge *)(ulong)bVar1;
      uVar15 = (ulong)((uint)bVar17 - (uint)bVar1);
      if (bVar17 == bVar1) {
        uVar15 = uVar16;
      }
      iVar5 = (int)uVar15;
      if (bVar17 != bVar1) goto LAB_0016d71e;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    iVar5 = 0;
LAB_0016d71e:
    if (iVar5 == 0) {
      secp256k1_scalar_get_b32(local_88,&local_c8);
      lVar7 = 0;
      uVar15 = extraout_RAX_00;
      do {
        uVar16 = uVar15 & 0xffffffff;
        bVar17 = local_68[lVar7];
        uVar10 = (uint)bVar17;
        bVar1 = local_88[lVar7];
        psVar13 = (secp256k1_ge *)(ulong)bVar1;
        uVar15 = (ulong)((uint)bVar17 - (uint)bVar1);
        if (bVar17 == bVar1) {
          uVar15 = uVar16;
        }
        iVar5 = (int)uVar15;
        if (bVar17 != bVar1) goto LAB_0016d754;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      iVar5 = 0;
LAB_0016d754:
      if (iVar5 == 0) {
        return;
      }
      goto LAB_0016d771;
    }
  }
  else {
    test_scalar_split_cold_3();
  }
  test_scalar_split_cold_1();
LAB_0016d771:
  test_scalar_split_cold_2();
  psStack_f0 = psVar18;
  psStack_f8 = full;
  iStack_1f8 = extraout_EDX;
  auStack_290._56_4_ = uVar10;
  sStack_200 = 3;
  psStack_1f0 = psVar13;
LAB_0016d7a9:
  uStack_16f = (psVar13->y).n[1];
  uStack_167 = (psVar13->y).n[2];
  uStack_17f = (psVar13->x).n[4];
  uStack_177 = (psVar13->y).n[0];
  auStack_1e0._81_8_ = (psVar13->x).n[2];
  uStack_187 = (psVar13->x).n[3];
  auStack_1e0._65_8_ = (psVar13->x).n[0];
  auStack_1e0._73_8_ = (psVar13->x).n[1];
  stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
  psStack_248 = (secp256k1_ge *)(auStack_1e0 + sStack_200 + 0x40);
  lVar7 = sStack_200 - 0x41;
  lStack_240 = -lVar7;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  auStack_290._0_8_ = 0;
  bStack_299 = auStack_290._56_4_ != 0 && sStack_200 == 0x21;
  uStack_1f4 = (uint)(lVar7 == 0) * 4;
  uStack_1e8 = (ulong)(lVar7 == 0 || sStack_200 == 0x21);
  puVar11 = (undefined1 *)0x0;
  while( true ) {
    psVar12 = (secp256k1_ge *)(auStack_290 + 0x40);
    auStack_1e0[0x40] = (char)puVar11;
    uVar10 = (uint)puVar11;
    uVar20 = *(uchar *)((long)(psVar13->y).n + 0x17) & 1 | 2;
    output = (secp256k1_ge *)(ulong)uVar20;
    if ((auStack_290._56_4_ == 0 || iStack_1f8 == 0) || (uVar10 & 4) != uStack_1f4) {
      psVar18 = (secp256k1_ge *)0x0;
    }
    else {
      psVar18 = (secp256k1_ge *)
                CONCAT71((int7)((ulong)psVar18 >> 8),
                         ((uVar10 & 0xfb) == uVar20 || uVar10 == 4) & (byte)uStack_1e8);
    }
    bVar17 = (byte)psVar18;
    psVar14 = CTX;
    if (((bStack_299 != false && (uVar10 & 0xfe) == 2) | bVar17) != 1) break;
    auStack_1e0._0_8_ = 0;
    auStack_1e0._8_8_ = 0;
    auStack_1e0._16_8_ = 0;
    auStack_1e0._24_8_ = 0;
    auStack_1e0._32_8_ = 0;
    auStack_1e0._40_8_ = 0;
    auStack_1e0._48_8_ = 0;
    auStack_1e0._56_8_ = 0;
    stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
    lStack_240 = 0x40;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    auStack_290._0_8_ = 0;
    psStack_2a8 = (secp256k1_ge *)0x16d981;
    ge = (secp256k1_ge *)auStack_1e0;
    psStack_248 = (secp256k1_ge *)auStack_1e0;
    iVar5 = secp256k1_ec_pubkey_parse
                      (CTX,(secp256k1_pubkey *)auStack_1e0,auStack_1e0 + 0x40,sStack_200);
    psVar13 = (secp256k1_ge *)auStack_1e0;
    if (iVar5 == 0) {
LAB_0016dec5:
      psStack_2a8 = (secp256k1_ge *)0x16deca;
      ec_pubkey_parse_pointtest_cold_14();
      psVar19 = psVar13;
LAB_0016deca:
      psStack_2a8 = (secp256k1_ge *)0x16decf;
      ec_pubkey_parse_pointtest_cold_13();
      psVar13 = psVar19;
LAB_0016decf:
      psStack_2a8 = (secp256k1_ge *)0x16ded4;
      ec_pubkey_parse_pointtest_cold_2();
      goto LAB_0016ded4;
    }
    stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430005;
    lStack_240 = 0x40;
    uStack_238 = 0;
    uStack_230 = 0;
    uStack_228 = 0;
    auStack_290._48_8_ = 0x41;
    auStack_290._0_8_ = 0x4d430001;
    auStack_290._16_8_ = 0x41;
    auStack_290._24_8_ = 0;
    auStack_290._32_8_ = 0;
    auStack_290._40_8_ = 0;
    puVar11 = auStack_290;
    uStack_298 = 0;
    uVar15 = 0x102;
    psStack_2a8 = (secp256k1_ge *)0x16da45;
    ge = psVar12;
    psVar14 = CTX;
    auStack_290._8_8_ = psVar12;
    auStack_290._60_4_ = uVar10;
    psStack_248 = (secp256k1_ge *)auStack_1e0;
    iVar5 = secp256k1_ec_pubkey_serialize
                      (CTX,(uchar *)psVar12,(size_t *)(auStack_290 + 0x30),
                       (secp256k1_pubkey *)auStack_1e0,0x102);
    psVar13 = psStack_1f0;
    psVar19 = (secp256k1_ge *)auStack_1e0;
    if (iVar5 == 0) goto LAB_0016deca;
    auStack_290._0_8_ = 0x4d430005;
    auStack_290._8_8_ = psVar12;
    auStack_290._16_8_ = auStack_290._48_8_;
    auStack_290._24_8_ = 0;
    auStack_290._32_8_ = 0;
    auStack_290._40_8_ = 0;
    uVar16 = (ulong)((long)psVar14 << 3) >> 0x33;
    uVar3 = (((long)psVar14 << 3 | (ulong)psVar14 >> 0x3d) << 0xd | uVar16) >> 3;
    psVar14 = (secp256k1_context *)(uVar3 << 0x33 | (uVar16 << 0x3d | uVar3) >> 0xd);
    uStack_298 = 0;
    if (auStack_290._48_8_ != 0x21) goto LAB_0016ded9;
    lVar7 = 1;
    puVar11 = (undefined1 *)(ulong)(uint)auStack_290._60_4_;
    do {
      bVar1 = auStack_290[lVar7 + 0x40];
      ge = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = auStack_1e0[lVar7 + 0x40];
      psVar14 = (secp256k1_context *)(ulong)bVar2;
      uVar16 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar16 = uVar15 & 0xffffffff;
      }
      iVar5 = (int)uVar16;
      if (bVar1 != bVar2) goto LAB_0016dae8;
      lVar7 = lVar7 + 1;
      uVar15 = uVar16;
    } while (lVar7 != 0x21);
    iVar5 = 0;
LAB_0016dae8:
    if (iVar5 != 0) goto LAB_0016dede;
    if ((sStack_200 == 0x21) && (auStack_290[0x40] != auStack_1e0[0x40])) goto LAB_0016dee3;
    psVar18 = (secp256k1_ge *)auStack_1e0;
    if (bVar17 != 0) {
      if (auStack_290[0x40] != (char)uVar20) goto LAB_0016dee8;
      psStack_2a8 = (secp256k1_ge *)0x16db3c;
      ge = &sStack_150;
      psVar14 = CTX;
      iVar5 = secp256k1_pubkey_load(CTX,&sStack_150,(secp256k1_pubkey *)psVar18);
      psVar12 = &sStack_150;
      if (iVar5 == 0) goto LAB_0016deed;
      auStack_1e0._48_8_ = 0;
      auStack_1e0._56_8_ = 0;
      auStack_1e0._32_8_ = 0;
      auStack_1e0._40_8_ = 0;
      auStack_1e0._16_8_ = 0;
      auStack_1e0._24_8_ = 0;
      auStack_1e0._0_8_ = 0;
      auStack_1e0._8_8_ = 0;
      auStack_290._0_8_ = 0x4d430001;
      auStack_290._16_8_ = 0x40;
      auStack_290._24_8_ = 0;
      auStack_290._32_8_ = 0;
      auStack_290._40_8_ = 0;
      psVar12 = (secp256k1_ge *)auStack_290;
      uStack_298 = 0;
      psStack_2a8 = (secp256k1_ge *)0x16dbc2;
      auStack_290._8_8_ = psVar18;
      secp256k1_ge_to_storage((secp256k1_ge_storage *)psVar18,&sStack_150);
      auStack_290._48_8_ = 0x41;
      auStack_290._0_8_ = 0x4d430001;
      output = (secp256k1_ge *)(auStack_290 + 0x40);
      auStack_290._16_8_ = 0x41;
      auStack_290._24_8_ = 0;
      auStack_290._32_8_ = 0;
      auStack_290._40_8_ = 0;
      puVar11 = (undefined1 *)0x40;
      uStack_298 = 0;
      psStack_2a8 = (secp256k1_ge *)0x16dc72;
      ge = output;
      psVar14 = CTX;
      auStack_290._8_8_ = output;
      iVar5 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output,(size_t *)(auStack_290 + 0x30),
                         (secp256k1_pubkey *)psVar18,2);
      if (iVar5 == 0) goto LAB_0016def2;
      auStack_290._0_8_ = 0x4d430005;
      auStack_290._8_8_ = output;
      auStack_290._16_8_ = auStack_290._48_8_;
      auStack_290._24_8_ = 0;
      auStack_290._32_8_ = 0;
      auStack_290._40_8_ = 0;
      uVar15 = (ulong)((long)psVar14 << 3) >> 0x33;
      uVar16 = (((long)psVar14 << 3 | (ulong)psVar14 >> 0x3d) << 0xd | uVar15) >> 3;
      psVar14 = (secp256k1_context *)(uVar16 << 0x33 | (uVar15 << 0x3d | uVar16) >> 0xd);
      puVar11 = (undefined1 *)0x40;
      uStack_298 = 0;
      if (auStack_290._48_8_ != 0x41) goto LAB_0016def7;
      psVar19 = output;
      if (auStack_290[0x40] != '\x04') goto LAB_0016defc;
      lVar7 = 0;
      puVar11 = (undefined1 *)(ulong)(uint)auStack_290._60_4_;
      do {
        bVar17 = abStack_24f[lVar7];
        ge = (secp256k1_ge *)(ulong)bVar17;
        bVar1 = *(byte *)((long)(psVar13->x).n + lVar7);
        psVar14 = (secp256k1_context *)(ulong)bVar1;
        iVar5 = (uint)bVar17 - (uint)bVar1;
        if (bVar17 != bVar1) goto LAB_0016dd10;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      iVar5 = 0;
LAB_0016dd10:
      if (iVar5 == 0) goto LAB_0016de7b;
      goto LAB_0016df01;
    }
LAB_0016de7b:
    psVar18 = (secp256k1_ge *)auStack_1e0;
    uVar10 = (int)puVar11 + 1;
    puVar11 = (undefined1 *)(ulong)uVar10;
    if (uVar10 == 0x100) goto LAB_0016dea1;
  }
  auStack_1e0._48_8_ = 0xfefefefefefefefe;
  auStack_1e0._56_8_ = 0xfefefefefefefefe;
  auStack_1e0._32_8_ = 0xfefefefefefefefe;
  auStack_1e0._40_8_ = 0xfefefefefefefefe;
  auStack_1e0._16_8_ = 0xfefefefefefefefe;
  auStack_1e0._24_8_ = 0xfefefefefefefefe;
  auStack_1e0._0_8_ = 0xfefefefefefefefe;
  auStack_1e0._8_8_ = 0xfefefefefefefefe;
  stack0xfffffffffffffdb0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
  psVar18 = (secp256k1_ge *)auStack_1e0;
  lStack_240 = 0x40;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  auStack_290._0_8_ = 0;
  psStack_2a8 = (secp256k1_ge *)0x16ddab;
  ge = psVar18;
  psStack_248 = psVar18;
  iVar5 = secp256k1_ec_pubkey_parse(CTX,(secp256k1_pubkey *)psVar18,auStack_1e0 + 0x40,sStack_200);
  psVar4 = CTX;
  if (iVar5 != 0) {
    psStack_2a8 = (secp256k1_ge *)0x16dec5;
    ec_pubkey_parse_pointtest_cold_1();
    goto LAB_0016dec5;
  }
  lStack_240 = 0x40;
  uStack_238 = 0;
  uStack_230 = 0;
  uStack_228 = 0;
  auStack_290._0_8_ = 0;
  unique0x10000a91 = (CTX->illegal_callback).fn;
  psStack_248 = (secp256k1_ge *)(CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) {
    psStack_2a8 = (secp256k1_ge *)0x16de9f;
    (*(CTX->illegal_callback).fn)("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
  }
  else {
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar4->illegal_callback).data = auStack_290;
  }
  ge = &sStack_150;
  psStack_2a8 = (secp256k1_ge *)0x16de50;
  psVar14 = CTX;
  iVar5 = secp256k1_pubkey_load(CTX,ge,(secp256k1_pubkey *)psVar18);
  psVar4 = CTX;
  if (iVar5 != 0) goto LAB_0016decf;
  (CTX->illegal_callback).fn = stack0xfffffffffffffdb0;
  (psVar4->illegal_callback).data = psStack_248;
  if (auStack_290._0_4_ == 1) goto LAB_0016de7b;
LAB_0016ded4:
  psStack_2a8 = (secp256k1_ge *)0x16ded9;
  ec_pubkey_parse_pointtest_cold_3();
  psVar19 = psVar13;
LAB_0016ded9:
  psVar13 = psVar19;
  psStack_2a8 = (secp256k1_ge *)0x16dede;
  ec_pubkey_parse_pointtest_cold_4();
LAB_0016dede:
  psStack_2a8 = (secp256k1_ge *)0x16dee3;
  ec_pubkey_parse_pointtest_cold_5();
LAB_0016dee3:
  psStack_2a8 = (secp256k1_ge *)0x16dee8;
  ec_pubkey_parse_pointtest_cold_12();
LAB_0016dee8:
  psStack_2a8 = (secp256k1_ge *)0x16deed;
  ec_pubkey_parse_pointtest_cold_6();
LAB_0016deed:
  psStack_2a8 = (secp256k1_ge *)0x16def2;
  ec_pubkey_parse_pointtest_cold_11();
LAB_0016def2:
  psStack_2a8 = (secp256k1_ge *)0x16def7;
  ec_pubkey_parse_pointtest_cold_10();
LAB_0016def7:
  psStack_2a8 = (secp256k1_ge *)0x16defc;
  ec_pubkey_parse_pointtest_cold_7();
  psVar19 = output;
LAB_0016defc:
  output = psVar12;
  psStack_2a8 = (secp256k1_ge *)0x16df01;
  ec_pubkey_parse_pointtest_cold_8();
LAB_0016df01:
  psStack_2a8 = (secp256k1_ge *)test_sort_helper;
  ec_pubkey_parse_pointtest_cold_9();
  psStack_2a8 = psVar13;
  puStack_2b0 = puVar11;
  if (count != 0) {
    sVar6 = 0;
    do {
      alStack_2d8[sVar6] =
           (long)((&(psVar14->ecmult_gen_ctx).scalar_offset)[(ge->x).n[sVar6] * 2 + -1].d + 3);
      sVar6 = sVar6 + 1;
    } while (count != sVar6);
  }
  pcStack_2e0 = (code *)0x16df4f;
  secp256k1_hsort(alStack_2d8,count,8,secp256k1_ec_pubkey_sort_cmp,CTX);
  if (count != 0) {
    sVar6 = 0;
    psVar9 = extraout_RDX;
    do {
      message = (secp256k1_scalar *)alStack_2d8[sVar6];
      sigs = (secp256k1_scalar *)0x0;
      sigr = psVar9;
      do {
        sigr = (secp256k1_scalar *)((ulong)sigr & 0xffffffff);
        bVar17 = *(byte *)((long)sigs->d + (long)message->d);
        recid = (int *)(ulong)bVar17;
        bVar1 = *(byte *)((long)sigs->d + (long)&psVar14->ecmult_gen_ctx);
        psVar9 = (secp256k1_scalar *)(ulong)((uint)bVar17 - (uint)bVar1);
        if (bVar17 != bVar1) goto LAB_0016df81;
        sigs = (secp256k1_scalar *)((long)sigs->d + 1);
      } while (sigs != (secp256k1_scalar *)0x40);
      psVar9 = (secp256k1_scalar *)0x0;
LAB_0016df81:
      if ((int)psVar9 != 0) {
        pcStack_2e0 = random_sign;
        test_sort_helper_cold_1();
        pcStack_2e0 = (code *)0x0;
        psStack_300 = psVar18;
        psStack_2f8 = output;
        psStack_2f0 = psVar14;
        psStack_2e8 = psVar19;
        do {
          testutil_random_scalar_order_test(&sStack_328);
          iVar5 = secp256k1_ecdsa_sig_sign
                            (&CTX->ecmult_gen_ctx,sigr,sigs,seckey,message,&sStack_328,recid);
        } while (iVar5 == 0);
        return;
      }
      sVar6 = sVar6 + 1;
      psVar14 = (secp256k1_context *)((psVar14->ecmult_gen_ctx).ge_offset.x.n + 3);
    } while (sVar6 != count);
  }
  return;
LAB_0016dea1:
  sStack_200 = sStack_200 + 1;
  if (sStack_200 == 0x42) {
    return;
  }
  goto LAB_0016d7a9;
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}